

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_WeightedAverageHash::Read(ON_WeightedAverageHash *this,ON_BinaryArchive *binary_archive)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 5) break;
    bVar2 = ON_BinaryArchive::ReadPoint(binary_archive,this->m_sum);
    this = (ON_WeightedAverageHash *)(this->m_sum + 1);
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return 4 < uVar3;
}

Assistant:

bool ON_WeightedAverageHash::Read(ON_BinaryArchive& binary_archive)
{
  for (int i = 0; i < dim; i++)
  {
    if (!binary_archive.ReadPoint(m_sum[i]))
      return false;
  }
  return true;
}